

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_tests.cpp
# Opt level: O2

void BasicTests::testRandomKeys(char *networkSourceFile)

{
  value_type pRVar1;
  uint uVar2;
  Graph *this;
  Random_keys *this_00;
  reference ppRVar3;
  _Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_> _Stack_58;
  string local_40;
  
  this = (Graph *)operator_new(0x88);
  Graph::Graph(this);
  Graph::addChargeLevel(this,0.5,1000,0.06);
  Graph::addChargeLevel(this,1.0,0x1a68,0.06);
  Graph::addChargeLevel(this,1.8,1000,0.06);
  std::__cxx11::string::string((string *)&local_40,networkSourceFile,(allocator *)&_Stack_58);
  Graph::input_read(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  Graph::defineModifiables(this);
  Graph::resetEdgesMarking(this);
  Graph::markOneDirectionInEdges(this);
  RK_Individual::criaCromossomos(this);
  this_00 = (Random_keys *)operator_new(0x38);
  Random_keys::Random_keys(this_00,100,1000);
  Random_keys::geraPopAleatoria(this_00,this);
  uVar2 = Random_keys::avancaGeracoes(this_00,this);
  std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::vector
            ((vector<RK_Individual_*,_std::allocator<RK_Individual_*>_> *)&_Stack_58,
             &this_00->popAtual);
  ppRVar3 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                      ((vector<RK_Individual_*,_std::allocator<RK_Individual_*>_> *)&_Stack_58,
                       (long)this_00->tamPop - 1);
  pRVar1 = *ppRVar3;
  std::_Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>::~_Vector_base(&_Stack_58);
  printf("        %.3f  &  ",pRVar1->active_loss * 100000.0);
  Graph::minVoltage(this);
  printf("        %.3f  &   ");
  printf("        %d    &   ",(ulong)uVar2);
  return;
}

Assistant:

void BasicTests::testRandomKeys(char *networkSourceFile) {
    Graph *g = new Graph();

    g->addChargeLevel(0.50, 1000, 0.06);
    g->addChargeLevel(1.00, 6760, 0.06);
    g->addChargeLevel(1.80, 1000, 0.06);

    g->input_read(networkSourceFile);
    g->defineModifiables();
    g->resetEdgesMarking();
    g->markOneDirectionInEdges();

    RK_Individual::criaCromossomos(g);

    Random_keys *rd = new Random_keys(100, 1000);

    rd->geraPopAleatoria(g);

//    rd->geraPopAleatoriaConfInicial(g, configuracaoInicial(networkSourceFile),
//                                    g->getEdgesSizes() / 2 - (g->getVerticesSize() - 1));

    int melhorGeracao = rd->avancaGeracoes(g);

    RK_Individual *best = rd->getPopAtual().at(rd->getTamPopulacao() - 1);

    printf("        %.3f  &  ", 100 * 1000 * best->getActiveLoss());
    printf("        %.3f  &   ", g->minVoltage());
    printf("        %d    &   ", melhorGeracao);
}